

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * r8row_min(int m,int n,double *a)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar7 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar4 = (ulong)(uint)m << 3;
  }
  uVar8 = 0;
  if (0 < m) {
    uVar8 = (ulong)(uint)m;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  pdVar3 = a + m;
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    dVar9 = a[uVar7];
    pdVar2[uVar7] = dVar9;
    pdVar5 = pdVar3;
    for (lVar6 = 1; lVar6 < n; lVar6 = lVar6 + 1) {
      dVar1 = *pdVar5;
      if (dVar1 < dVar9) {
        pdVar2[uVar7] = dVar1;
        dVar9 = dVar1;
      }
      pdVar5 = pdVar5 + m;
    }
    pdVar3 = pdVar3 + 1;
  }
  return pdVar2;
}

Assistant:

double *r8row_min ( int m, int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8ROW_MIN returns the minimums of an R8ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, double A[M*N], the array to be examined.
//
//    Output, double R8ROW_MIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  double *amin;

  amin = new double[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}